

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdpeer.cc
# Opt level: O2

int __thiscall bdSpace::scanOutOfDatePeers(bdSpace *this,list<bdId,_std::allocator<bdId>_> *peerIds)

{
  uint32_t uVar1;
  size_t sVar2;
  _List_node_base *p_Var3;
  long lVar4;
  iterator __position;
  _List_node_base *this_00;
  uint32_t uVar5;
  map<bdMetric,_bdId,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdId>_>_>
  closest;
  _Rb_tree<bdMetric,_std::pair<const_bdMetric,_bdId>,_std::_Select1st<std::pair<const_bdMetric,_bdId>_>,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdId>_>_>
  local_60;
  
  uVar1 = this->mAttachedCount;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar5 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = (_List_node_base *)time((time_t *)0x0);
  this_00 = (_List_node_base *)
            (this->buckets).super__Vector_base<bdBucket,_std::allocator<bdBucket>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (this_00 ==
        (_List_node_base *)
        (this->buckets).super__Vector_base<bdBucket,_std::allocator<bdBucket>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if ((600 < (long)p_Var3 - this->mAttachTS) || (uVar5 != this->mAttachedCount)) {
        updateAttachedPeers(this);
        this->mAttachTS = (time_t)p_Var3;
      }
      sVar2 = (peerIds->super__List_base<bdId,_std::allocator<bdId>_>)._M_impl._M_node._M_size;
      std::
      _Rb_tree<bdMetric,_std::pair<const_bdMetric,_bdId>,_std::_Select1st<std::pair<const_bdMetric,_bdId>_>,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdId>_>_>
      ::~_Rb_tree(&local_60);
      return (int)sVar2;
    }
    __position._M_node =
         (((list<bdPeer,_std::allocator<bdPeer>_> *)&this_00->_M_next)->
         super__List_base<bdPeer,_std::allocator<bdPeer>_>)._M_impl._M_node.super__List_node_base.
         _M_next;
    while (__position._M_node != this_00) {
      if ((uVar1 == 0) || (((ulong)__position._M_node[5]._M_next & 2) == 0)) {
LAB_0010e37a:
        if ((300 < (long)p_Var3 - (long)__position._M_node[3]._M_prev) &&
           ((300 < (long)p_Var3 - (long)__position._M_node[4]._M_next ||
            (((ulong)__position._M_node[3]._M_next & 0x200000000) == 0)))) {
          std::__cxx11::list<bdId,_std::allocator<bdId>_>::push_back
                    (peerIds,(value_type *)(__position._M_node + 1));
          __position._M_node[3]._M_prev = p_Var3;
        }
      }
      else {
        if (((long)p_Var3 - (long)__position._M_node[3]._M_prev < 0x12) ||
           ((long)p_Var3 - (long)__position._M_node[4]._M_next < 0x12)) {
          uVar5 = uVar5 + 1;
          goto LAB_0010e37a;
        }
        std::__cxx11::list<bdId,_std::allocator<bdId>_>::push_back
                  (peerIds,(value_type *)(__position._M_node + 1));
        __position._M_node[3]._M_prev = p_Var3;
        uVar5 = uVar5 + 1;
      }
      lVar4 = (long)p_Var3 - (long)__position._M_node[4]._M_next;
      if ((long)p_Var3 - (long)__position._M_node[4]._M_prev < 0x10) {
        if (0x267 < lVar4) goto LAB_0010e3e9;
LAB_0010e3d8:
        __position._M_node = (__position._M_node)->_M_next;
      }
      else {
        if (((ulong)__position._M_node[3]._M_next & 0x200000000) != 0 && lVar4 < 0x268)
        goto LAB_0010e3d8;
LAB_0010e3e9:
        __position = std::__cxx11::list<bdPeer,_std::allocator<bdPeer>_>::erase
                               (this_00,__position._M_node);
      }
    }
    this_00 = (_List_node_base *)&this_00[1]._M_prev;
  } while( true );
}

Assistant:

int	bdSpace::scanOutOfDatePeers(std::list<bdId> &peerIds) {
	/* 
	 * 
	 */
	bool doAttached = (mAttachedCount > 0);
	uint32_t attachedCount = 0;

	std::map<bdMetric, bdId> closest;
	std::map<bdMetric, bdId>::iterator mit;

	std::vector<bdBucket>::iterator it;
	std::list<bdPeer>::iterator eit;
	time_t ts = time(NULL);

	/* iterate through the buckets, and sort by distance */
	for (it = buckets.begin(); it != buckets.end(); it++) {
		for (eit = it->entries.begin(); eit != it->entries.end(); )
		{
			bool added = false;
			if (doAttached) {
				if (eit->mExtraFlags & BITDHT_PEER_EXFLAG_ATTACHED) {
					/* add to send list, if we haven't pinged recently */
					if ((ts - eit->mLastSendTime > BITDHT_ATTACHED_SEND_PERIOD ) &&
						(ts - eit->mLastRecvTime > BITDHT_ATTACHED_SEND_PERIOD )) {
						peerIds.push_back(eit->mPeerId);
						eit->mLastSendTime = ts;
						added = true;
					}
					attachedCount++;
				}
			}
				

			/* timeout on last send time! */
			if ((!added) && (ts - eit->mLastSendTime > BITDHT_MAX_SEND_PERIOD )) {
				/* We want to ping a peer iff:
		 	 	 * 1) They are out-of-date: mLastRecvTime is too old.
			 	 * 2) They don't have 0x0001 flag (we haven't received a PONG) and never sent.
			 	 */
				if ((ts - eit->mLastRecvTime > BITDHT_MAX_SEND_PERIOD ) || 
					!(eit->mPeerFlags & BITDHT_PEER_STATUS_RECV_PONG)) {
					peerIds.push_back(eit->mPeerId);
					eit->mLastSendTime = ts;
				}
			}


			/* we also want to remove very old entries (should it happen here?) 
			 * which are not pushed out by newer entries (will happen in for closer buckets)
			 */

			bool discard = false;
			/* discard very old entries */
			if (ts - eit->mLastRecvTime > BITDHT_DISCARD_PERIOD) {
				discard = true;
			}
		
			/* discard peers which have not responded to anything (ie have no flags set) */
			/* changed into have not id'ed themselves, as we've added ping to list of flags. */
			if ((ts - eit->mFoundTime > BITDHT_MAX_RESPONSE_PERIOD ) &&
				!(eit->mPeerFlags & BITDHT_PEER_STATUS_RECV_PONG)) {
				discard = true;
			}
			

			/* INCREMENT */
			if (discard) {
				eit = it->entries.erase(eit);
			}
			else
			{
				eit++;
			}
		}
	}

#define ATTACH_UPDATE_PERIOD	600

	if ((ts - mAttachTS > ATTACH_UPDATE_PERIOD) || (attachedCount != mAttachedCount)) {
		//std::cerr << "Updating ATTACH Stuff";
		//std::cerr << std::endl;
		updateAttachedPeers(); /* XXX TEMP HACK to look at stability */
		mAttachTS = ts;
	}

	return (peerIds.size());
}